

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O0

int __thiscall
zmq::timers_t::add(timers_t *this,size_t interval_,timers_timer_fn *handler_,void *arg_)

{
  int *piVar1;
  uint64_t uVar2;
  void *in_RCX;
  timers_timer_fn *in_RDX;
  size_t in_RSI;
  clock_t *in_RDI;
  timer_t timer;
  uint64_t when;
  multimap<unsigned_long,_zmq::timers_t::timer_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_zmq::timers_t::timer_t>_>_>
  *in_stack_ffffffffffffff68;
  pair<const_unsigned_long,_zmq::timers_t::timer_t> local_78;
  timer_t local_50;
  unsigned_long local_30;
  void *local_28;
  timers_timer_fn *local_20;
  size_t local_18;
  int local_4;
  
  if (in_RDX == (timers_timer_fn *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0xe;
    local_4 = -1;
  }
  else {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    uVar2 = clock_t::now_ms(in_RDI);
    local_30 = uVar2 + local_18;
    local_50.timer_id = *(int *)((long)&in_RDI->_last_tsc + 4) + 1;
    *(int *)((long)&in_RDI->_last_tsc + 4) = local_50.timer_id;
    local_50.interval = local_18;
    local_50.handler = local_20;
    local_50.arg = local_28;
    std::pair<const_unsigned_long,_zmq::timers_t::timer_t>::
    pair<unsigned_long_&,_zmq::timers_t::timer_t_&,_true>(&local_78,&local_30,&local_50);
    std::
    multimap<unsigned_long,_zmq::timers_t::timer_t,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_zmq::timers_t::timer_t>_>_>
    ::insert(in_stack_ffffffffffffff68,(value_type *)0x1d0c0e);
    local_4 = local_50.timer_id;
  }
  return local_4;
}

Assistant:

int zmq::timers_t::add (size_t interval_, timers_timer_fn handler_, void *arg_)
{
    if (handler_ == NULL) {
        errno = EFAULT;
        return -1;
    }

    uint64_t when = _clock.now_ms () + interval_;
    timer_t timer = {++_next_timer_id, interval_, handler_, arg_};
    _timers.insert (timersmap_t::value_type (when, timer));

    return timer.timer_id;
}